

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_locate(Integer g_a,Integer *subscript,Integer *owner)

{
  short sVar1;
  C_Integer *pCVar2;
  bool bVar3;
  int iVar4;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int _i_2;
  int _ndim_1;
  C_Integer *map_2;
  int b_2;
  int found_2;
  int candidate_2;
  C_Integer *map_1;
  int b_1;
  int found_1;
  int candidate_1;
  int _ndim;
  int _i_1;
  Integer _offset;
  Integer *_mapc;
  int _type;
  Integer index [7];
  Integer i;
  Integer _factor;
  Integer _i;
  C_Integer *map;
  int b;
  int found;
  int candidate;
  char err_string_1 [256];
  char err_string [256];
  Integer proc_s [7];
  Integer ga_handle;
  Integer ndim;
  Integer dpos;
  Integer proc;
  Integer d;
  int local_350;
  int local_33c;
  int local_334;
  int local_324;
  int local_31c;
  int local_314;
  long local_310;
  long alStackY_2f8 [8];
  long local_2b8;
  long local_2b0;
  long local_2a8;
  C_Integer *local_2a0;
  int local_294;
  uint local_290;
  int local_28c;
  char local_288 [208];
  Integer in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char local_188 [256];
  long alStack_88 [8];
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  long local_10;
  
  local_48 = in_RDI + 1000;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_188,"%s: INVALID ARRAY HANDLE","nga_locate");
    pnga_error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_288,"%s: ARRAY NOT ACTIVE","nga_locate");
    pnga_error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  sVar1 = GA[local_48].ndim;
  local_40 = (long)sVar1;
  if (GA[local_48].distr_type == 0) {
    local_28 = 0;
    *local_20 = -1;
    for (; local_28 < sVar1; local_28 = local_28 + 1) {
      if ((*(long *)(local_18 + local_28 * 8) < 1) ||
         (GA[local_48].dims[local_28] < *(long *)(local_18 + local_28 * 8))) {
        return 0;
      }
    }
    local_38 = 0;
    for (local_28 = 0; local_28 < local_40; local_28 = local_28 + 1) {
      local_2a0 = GA[local_48].mapc + local_38;
      local_28c = (int)(GA[local_48].scale[local_28] * (double)*(long *)(local_18 + local_28 * 8));
      if (local_28c == GA[local_48].nblock[local_28]) {
        local_28c = GA[local_48].nblock[local_28] + -1;
      }
      local_290 = 0;
      if (*(long *)(local_18 + local_28 * 8) < local_2a0[local_28c]) {
        local_294 = local_28c + -1;
        while ((-1 < local_294 &&
               (local_290 = (uint)(local_2a0[local_294] <= *(long *)(local_18 + local_28 * 8)),
               local_290 == 0))) {
          local_294 = local_294 + -1;
        }
      }
      else {
        local_294 = local_28c;
        while ((local_294 < GA[local_48].nblock[local_28] + -1 &&
               (local_290 = (uint)(*(long *)(local_18 + local_28 * 8) < local_2a0[local_294 + 1]),
               local_290 == 0))) {
          local_294 = local_294 + 1;
        }
      }
      if (local_290 == 0) {
        local_294 = GA[local_48].nblock[local_28] + -1;
      }
      alStack_88[local_28] = (long)local_294;
      local_38 = GA[local_48].nblock[local_28] + local_38;
    }
    local_2b0 = 1;
    local_30 = 0;
    for (local_2a8 = 0; local_2a8 < local_40; local_2a8 = local_2a8 + 1) {
      local_30 = alStack_88[local_2a8] * local_2b0 + local_30;
      if (local_2a8 < local_40 + -1) {
        local_2b0 = GA[local_48].nblock[local_2a8] * local_2b0;
      }
    }
    *local_20 = local_30;
    if (0 < GA[local_48].num_rstrctd) {
      *local_20 = GA[local_48].rstrctd_list[*local_20];
    }
  }
  else {
    pCVar2 = GA[local_48].mapc;
    iVar4 = (int)GA[local_48].ndim;
    if (GA[local_48].distr_type == 0) {
      local_310 = 0;
      for (local_314 = 0; local_314 < iVar4; local_314 = local_314 + 1) {
        local_31c = (int)(GA[local_48].scale[local_314] *
                         (double)*(long *)(local_18 + (long)local_314 * 8));
        if (local_31c == GA[local_48].nblock[local_314]) {
          local_31c = GA[local_48].nblock[local_314] + -1;
        }
        bVar3 = false;
        if (*(long *)(local_18 + (long)local_314 * 8) < pCVar2[local_310 + local_31c]) {
          do {
            local_324 = local_31c + -1;
            if (local_324 < 0) break;
            bVar3 = pCVar2[local_310 + local_324] <= *(long *)(local_18 + (long)local_314 * 8);
            local_31c = local_324;
          } while (!bVar3);
        }
        else {
          local_324 = local_31c;
          while ((local_324 < GA[local_48].nblock[local_314] + -1 &&
                 (bVar3 = *(long *)(local_18 + (long)local_314 * 8) <
                          pCVar2[local_310 + (local_324 + 1)], !bVar3))) {
            local_324 = local_324 + 1;
          }
        }
        if (!bVar3) {
          local_324 = GA[local_48].nblock[local_314] + -1;
        }
        alStackY_2f8[local_314] = (long)local_324;
        local_310 = GA[local_48].nblock[local_314] + local_310;
      }
    }
    else if (GA[local_48].distr_type == 4) {
      local_310 = 0;
      for (local_314 = 0; local_314 < iVar4; local_314 = local_314 + 1) {
        local_334 = (int)(GA[local_48].scale[local_314] *
                         (double)*(long *)(local_18 + (long)local_314 * 8));
        if ((long)local_334 == GA[local_48].num_blocks[local_314]) {
          local_334 = (int)GA[local_48].num_blocks[local_314] + -1;
        }
        bVar3 = false;
        if (*(long *)(local_18 + (long)local_314 * 8) < pCVar2[local_310 + local_334]) {
          do {
            local_33c = local_334 + -1;
            if (local_33c < 0) break;
            bVar3 = pCVar2[local_310 + local_33c] <= *(long *)(local_18 + (long)local_314 * 8);
            local_334 = local_33c;
          } while (!bVar3);
        }
        else {
          local_33c = local_334;
          while (((long)local_33c < GA[local_48].num_blocks[local_314] + -1 &&
                 (bVar3 = *(long *)(local_18 + (long)local_314 * 8) <
                          pCVar2[local_310 + (local_33c + 1)], !bVar3))) {
            local_33c = local_33c + 1;
          }
        }
        if (!bVar3) {
          local_33c = (int)GA[local_48].num_blocks[local_314] + -1;
        }
        alStackY_2f8[local_314] = (long)local_33c;
        local_310 = GA[local_48].num_blocks[local_314] + local_310;
      }
    }
    else {
      for (local_314 = 0; local_314 < iVar4; local_314 = local_314 + 1) {
        alStackY_2f8[local_314] =
             (*(long *)(local_18 + (long)local_314 * 8) + -1) / GA[local_48].block_dims[local_314];
      }
    }
    local_2b8 = alStackY_2f8[GA[local_48].ndim + -1];
    for (local_350 = GA[local_48].ndim + -2; -1 < local_350; local_350 = local_350 + -1) {
      local_2b8 = local_2b8 * GA[local_48].num_blocks[local_350] + alStackY_2f8[local_350];
    }
    *local_20 = local_2b8;
  }
  return 1;
}

Assistant:

logical pnga_locate(Integer g_a, Integer* subscript, Integer* owner)
{
Integer d, proc, dpos, ndim, ga_handle = GA_OFFSET + g_a, proc_s[MAXDIM];

   ga_check_handleM(g_a, "nga_locate");
   ndim = GA[ga_handle].ndim;

   if (GA[ga_handle].distr_type == REGULAR) {
     for(d=0, *owner=-1; d< ndim; d++) 
       if(subscript[d]< 1 || subscript[d]>GA[ga_handle].dims[d]) return FALSE;

     for(d = 0, dpos = 0; d< ndim; d++){
       findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d],
           GA[ga_handle].scale[d], subscript[d], &proc_s[d]);
       dpos += GA[ga_handle].nblock[d];
     }

     ga_ComputeIndexM(&proc, ndim, proc_s, GA[ga_handle].nblock); 

     *owner = proc;
     if (GA[ga_handle].num_rstrctd > 0) {
       *owner = GA[ga_handle].rstrctd_list[*owner];
     }
   } else {
     Integer i;
     Integer index[MAXDIM];
     gam_find_block_indices_from_subscript(ga_handle,subscript,index);
     gam_find_block_from_indices(ga_handle,i,index);    
     *owner = i;
   }
   
   return TRUE;
}